

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O1

nhrect * get_rect(nhrect *r)

{
  nhrect *pnVar1;
  int iVar2;
  
  if (0 < rect_cnt) {
    pnVar1 = rect;
    iVar2 = rect_cnt;
    do {
      if ((((pnVar1->lx <= r->lx) && (pnVar1->ly <= r->ly)) && (r->hx <= pnVar1->hx)) &&
         (r->hy <= pnVar1->hy)) {
        return pnVar1;
      }
      pnVar1 = pnVar1 + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return (nhrect *)0x0;
}

Assistant:

struct nhrect *get_rect(struct nhrect *r)
{
	struct nhrect *rectp;
	int lx, ly, hx, hy;
	int i;

	lx = r->lx; ly = r->ly;
	hx = r->hx; hy = r->hy;
	for (i=0,rectp = &rect[0];i<rect_cnt;i++,rectp++)
	    if ( lx >= rectp->lx && ly >= rectp->ly &&
		 hx <= rectp->hx && hy <= rectp->hy)
		return rectp;
	return 0;
}